

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O1

void __thiscall
PDFUsedFont::PDFUsedFont
          (PDFUsedFont *this,FT_Face inInputFace,string *inFontFilePath,
          string *inAdditionalMetricsFontFilePath,long inFontIndex,ObjectsContext *inObjectsContext,
          bool inEmbedFont)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_PDFUsedFont = (_func_int **)&PTR__PDFUsedFont_003ac6e0;
  FreeTypeFaceWrapper::FreeTypeFaceWrapper
            (&this->mFaceWrapper,inInputFace,inFontFilePath,inAdditionalMetricsFontFilePath,
             inFontIndex,true);
  p_Var1 = &(this->mAdvanceCache)._M_t._M_impl.super__Rb_tree_header;
  (this->mAdvanceCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mAdvanceCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mAdvanceCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mAdvanceCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mAdvanceCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mObjectsContext = inObjectsContext;
  this->mWrittenFont = (IWrittenFont *)0x0;
  this->mEmbedFont = inEmbedFont;
  return;
}

Assistant:

PDFUsedFont::PDFUsedFont(FT_Face inInputFace,
						 const std::string& inFontFilePath,
						 const std::string& inAdditionalMetricsFontFilePath,
                         long inFontIndex,
						 ObjectsContext* inObjectsContext,
						 bool inEmbedFont):mFaceWrapper(inInputFace,inFontFilePath,inAdditionalMetricsFontFilePath,inFontIndex)
{
	mObjectsContext = inObjectsContext;
	mWrittenFont = NULL;
	mEmbedFont = inEmbedFont;
}